

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesMainForm.cxx
# Opt level: O0

void __thiscall cmCursesMainForm::HandleInput(cmCursesMainForm *this)

{
  FORM *form;
  byte bVar1;
  _Bool _Var2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  undefined8 uVar8;
  FIELD *pFVar9;
  long *p2;
  ulong uVar10;
  char *pcVar11;
  long *plVar12;
  cmState *pcVar13;
  size_t sVar14;
  size_t sVar15;
  reference pvVar16;
  cmCursesLongMessageForm *pcVar17;
  long *plVar18;
  reference ppcVar19;
  int p1;
  int p1_00;
  int p1_01;
  int p1_02;
  int p1_03;
  int local_384;
  uint local_35c;
  uint local_328;
  int local_324;
  int local_310;
  uint local_30c;
  uint local_2a0;
  uint local_29c;
  int local_27c;
  uint local_278;
  int local_274;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_250;
  string *local_248;
  cmCursesCacheEntryComposite **local_240;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_238;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  local_230;
  __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
  nextEntryIt;
  string nextVal;
  string local_200;
  long *local_1e0;
  cmCursesWidget *lbl_1;
  FIELD *nextCur;
  size_t findex_3;
  FIELD *cur_3;
  cmCursesLongMessageForm *msgs_1;
  cmCursesLongMessageForm *msgs;
  char *message;
  string local_1a0;
  allocator<char> local_179;
  string local_178;
  allocator<char> local_151;
  string local_150;
  char *local_130;
  char *existingValue;
  char *helpString;
  char *curField;
  cmCursesWidget *lbl;
  FIELD *pFStack_108;
  int findex_2;
  FIELD *cur_2;
  FIELD *pFStack_f8;
  int findex_1;
  FIELD *cur_1;
  size_t findex;
  FIELD *cur;
  uint local_d8;
  bool widgetHandled;
  int key;
  undefined1 local_c8 [8];
  string searchstr;
  char debugMessage [128];
  cmCursesWidget *currentWidget;
  FIELD *currentField;
  int y;
  int x;
  cmCursesMainForm *this_local;
  
  currentField._0_4_ = 0;
  if ((this->super_cmCursesForm).Form == (FORM *)0x0) {
    return;
  }
  do {
    while( true ) {
      while( true ) {
        (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
        iVar7 = 0;
        PrintKeys(this,0);
        if ((this->SearchMode & 1U) != 0) {
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_c8,"Search: ",&this->SearchString);
          uVar8 = std::__cxx11::string::c_str();
          (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,uVar8);
          PrintKeys(this,1);
          uVar4 = std::__cxx11::string::size();
          curses_move((uint)currentField - 5,uVar4);
          if (_stdscr == (long *)0x0) {
            local_274 = -1;
          }
          else {
            local_274 = *(short *)((long)_stdscr + 4) + 1;
          }
          iVar7 = 0;
          wtouchln(_stdscr,0,local_274,1);
          refresh();
          std::__cxx11::string::~string((string *)local_c8);
        }
        local_d8 = wgetch(_stdscr);
        if (_stdscr == (long *)0x0) {
          local_278 = 0xffffffff;
        }
        else {
          local_278 = (int)*(short *)((long)_stdscr + 4) + 1;
        }
        currentField._0_4_ = local_278;
        if (_stdscr == (long *)0x0) {
          local_27c = -1;
        }
        else {
          local_27c = *(short *)((long)_stdscr + 6) + 1;
        }
        if ((0x40 < local_27c) && (5 < (int)local_278)) break;
        if (local_d8 == 0x71) {
          return;
        }
      }
      pFVar9 = current_field((this->super_cmCursesForm).Form);
      p2 = (long *)field_userptr(pFVar9);
      uVar4 = local_d8;
      cur._7_1_ = 0;
      plVar18 = p2;
      if ((this->SearchMode & 1U) == 0) {
        if ((p2 != (long *)0x0) && ((this->SearchMode & 1U) == 0)) {
          plVar18 = _stdscr;
          bVar1 = (**(code **)(*p2 + 0x10))(p2,&local_d8,this);
          cur._7_1_ = bVar1 & 1;
          if (cur._7_1_ != 0) {
            this->OkToGenerate = false;
            (*(this->super_cmCursesForm)._vptr_cmCursesForm[4])();
            PrintKeys(this,0);
          }
        }
      }
      else if ((local_d8 == 10) || (local_d8 == 0x157)) {
        this->SearchMode = false;
        uVar10 = std::__cxx11::string::empty();
        if ((uVar10 & 1) == 0) {
          pcVar11 = (char *)std::__cxx11::string::c_str();
          JumpToCacheEntry(this,pcVar11);
          std::__cxx11::string::operator=
                    ((string *)&this->OldSearchString,(string *)&this->SearchString);
        }
        std::__cxx11::string::operator=((string *)&this->SearchString,"");
      }
      else if (((((int)local_d8 < 0x61) || (0x7a < (int)local_d8)) &&
               (((int)local_d8 < 0x41 || (0x5a < (int)local_d8)))) &&
              ((((int)local_d8 < 0x30 || (0x39 < (int)local_d8)) && (local_d8 != 0x5f)))) {
        uVar5 = ctrl((EVP_PKEY_CTX *)0x68,iVar7,p1,p2);
        plVar18 = (long *)(ulong)uVar5;
        if ((((uVar4 == uVar5) || (local_d8 == 0x107)) || (local_d8 == 0x14a)) &&
           (uVar10 = std::__cxx11::string::empty(), (uVar10 & 1) == 0)) {
          std::__cxx11::string::size();
          std::__cxx11::string::resize((ulong)&this->SearchString);
        }
      }
      else {
        plVar12 = (long *)std::__cxx11::string::size();
        plVar18 = (long *)(long)(local_27c + -10);
        if (plVar12 < plVar18) {
          std::__cxx11::string::operator+=((string *)&this->SearchString,(char)local_d8);
        }
      }
      if (((p2 != (long *)0x0) && ((cur._7_1_ & 1) != 0)) || ((this->SearchMode & 1U) != 0))
      goto LAB_0014490c;
      iVar7 = 0x732736;
      sprintf(searchstr.field_2._M_local_buf + 8,"Main form handling input, key: %d",(ulong)local_d8
             );
      cmCursesForm::LogMessage(searchstr.field_2._M_local_buf + 8);
      uVar4 = local_d8;
      if (local_d8 == 0x71) {
        return;
      }
      if (local_d8 != 0x102) break;
LAB_00143a46:
      findex = (size_t)current_field((this->super_cmCursesForm).Form);
      iVar7 = field_index((FIELD *)findex);
      cur_1 = (FIELD *)(long)iVar7;
      if (cur_1 != (FIELD *)(this->NumberOfVisibleEntries * 3 + -1)) {
        _Var2 = new_page(this->Fields[(long)((long)&cur_1->status + 1)]);
        if (_Var2) {
          form_driver((this->super_cmCursesForm).Form,0x200);
        }
        else {
          form_driver((this->super_cmCursesForm).Form,0x204);
        }
        goto LAB_0014490c;
      }
    }
    uVar6 = ctrl((EVP_PKEY_CTX *)0x6e,iVar7,p1_00,plVar18);
    uVar5 = local_d8;
    if ((uVar4 == uVar6) || (local_d8 == 0x6a)) goto LAB_00143a46;
    if (local_d8 != 0x103) {
      uVar6 = ctrl((EVP_PKEY_CTX *)0x70,iVar7,p1_01,(void *)(ulong)uVar6);
      uVar4 = local_d8;
      if ((uVar5 != uVar6) && (local_d8 != 0x6b)) {
        if (local_d8 != 0x152) {
          uVar6 = ctrl((EVP_PKEY_CTX *)0x64,iVar7,p1_02,(void *)(ulong)uVar6);
          uVar5 = local_d8;
          if (uVar4 != uVar6) {
            if ((local_d8 == 0x153) ||
               (uVar4 = ctrl((EVP_PKEY_CTX *)0x75,iVar7,p1_03,(void *)(ulong)uVar6), uVar5 == uVar4)
               ) {
              form_driver((this->super_cmCursesForm).Form,0x201);
            }
            else if (local_d8 == 99) {
              Configure(this,0);
            }
            else if (local_d8 == 0x68) {
              if (_stdscr == (long *)0x0) {
                local_29c = 0xffffffff;
              }
              else {
                local_29c = (int)*(short *)((long)_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_29c;
              if (_stdscr == (long *)0x0) {
                local_2a0 = 0xffffffff;
              }
              else {
                local_2a0 = (int)*(short *)((long)_stdscr + 6) + 1;
              }
              pFStack_108 = current_field((this->super_cmCursesForm).Form);
              lbl._4_4_ = field_index(pFStack_108);
              curField = (char *)field_userptr(this->Fields[lbl._4_4_ + -2]);
              helpString = (char *)(**(code **)(*(long *)curField + 0x28))();
              existingValue = (char *)0x0;
              pcVar13 = cmake::GetState(this->CMakeInstance);
              pcVar11 = helpString;
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_150,pcVar11,&local_151);
              pcVar11 = cmState::GetCacheEntryValue(pcVar13,&local_150);
              std::__cxx11::string::~string((string *)&local_150);
              std::allocator<char>::~allocator(&local_151);
              local_130 = pcVar11;
              if (pcVar11 != (char *)0x0) {
                pcVar13 = cmake::GetState(this->CMakeInstance);
                pcVar11 = helpString;
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_178,pcVar11,&local_179);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1a0,"HELPSTRING",(allocator<char> *)((long)&message + 7)
                          );
                existingValue = cmState::GetCacheEntryProperty(pcVar13,&local_178,&local_1a0);
                std::__cxx11::string::~string((string *)&local_1a0);
                std::allocator<char>::~allocator((allocator<char> *)((long)&message + 7));
                std::__cxx11::string::~string((string *)&local_178);
                std::allocator<char>::~allocator(&local_179);
              }
              if (existingValue == (char *)0x0) {
                pvVar16 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&this->HelpMessage,1);
                std::__cxx11::string::operator=((string *)pvVar16,"");
              }
              else {
                sVar14 = strlen(helpString);
                sVar15 = strlen(existingValue);
                msgs = (cmCursesLongMessageForm *)operator_new__(sVar14 + sVar15 + 0x40);
                sprintf((char *)msgs,"Current option is: %s\nHelp string for this option is: %s\n",
                        helpString,existingValue);
                pcVar17 = msgs;
                pvVar16 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](&this->HelpMessage,1);
                std::__cxx11::string::operator=((string *)pvVar16,(char *)pcVar17);
                if (msgs != (cmCursesLongMessageForm *)0x0) {
                  operator_delete__(msgs);
                }
              }
              pcVar17 = (cmCursesLongMessageForm *)operator_new(0x60);
              cmCursesLongMessageForm::cmCursesLongMessageForm(pcVar17,&this->HelpMessage,"Help.");
              cmCursesForm::CurrentForm = (cmCursesForm *)pcVar17;
              msgs_1 = pcVar17;
              (*(pcVar17->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (pcVar17,1,1,(ulong)local_2a0,(ulong)local_29c);
              (*(msgs_1->super_cmCursesForm)._vptr_cmCursesForm[2])();
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])
                        (this,1,1,(ulong)local_2a0,(ulong)local_29c);
              set_current_field((this->super_cmCursesForm).Form,pFStack_108);
            }
            else if (local_d8 == 0x6c) {
              if (_stdscr == (long *)0x0) {
                local_30c = 0xffffffff;
              }
              else {
                local_30c = (int)*(short *)((long)_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_30c;
              if (_stdscr == (long *)0x0) {
                local_310 = -1;
              }
              else {
                local_310 = *(short *)((long)_stdscr + 6) + 1;
              }
              pFVar9 = (FIELD *)operator_new(0x60);
              cmCursesLongMessageForm::cmCursesLongMessageForm
                        ((cmCursesLongMessageForm *)pFVar9,&this->Errors,
                         "Errors occurred during the last pass.");
              cmCursesForm::CurrentForm = (cmCursesForm *)pFVar9;
              cur_3 = pFVar9;
              (**(code **)(*(long *)pFVar9 + 0x18))(pFVar9,1,1,local_310,local_30c);
              (**(code **)(*(long *)cur_3 + 0x10))();
              cmCursesForm::CurrentForm = &this->super_cmCursesForm;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
            }
            else if (local_d8 == 0x2f) {
              this->SearchMode = true;
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[6])(this,"Search");
              PrintKeys(this,1);
              if (_stdscr == (long *)0x0) {
                local_324 = -1;
              }
              else {
                local_324 = *(short *)((long)_stdscr + 4) + 1;
              }
              wtouchln(_stdscr,0,local_324,1);
              refresh();
            }
            else if (local_d8 == 0x6e) {
              uVar10 = std::__cxx11::string::empty();
              if ((uVar10 & 1) == 0) {
                pcVar11 = (char *)std::__cxx11::string::c_str();
                JumpToCacheEntry(this,pcVar11);
              }
            }
            else if (local_d8 == 0x74) {
              if ((this->AdvancedMode & 1U) == 0) {
                this->AdvancedMode = true;
              }
              else {
                this->AdvancedMode = false;
              }
              if (_stdscr == (long *)0x0) {
                local_328 = 0xffffffff;
              }
              else {
                local_328 = (int)*(short *)((long)_stdscr + 4) + 1;
              }
              currentField._0_4_ = local_328;
              RePost(this);
              (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
            }
            else if (local_d8 == 0x67) {
              if ((this->OkToGenerate & 1U) != 0) {
                Generate(this);
                return;
              }
            }
            else if ((local_d8 == 100) && (this->NumberOfVisibleEntries != 0)) {
              this->OkToGenerate = false;
              findex_3 = (size_t)current_field((this->super_cmCursesForm).Form);
              iVar7 = field_index((FIELD *)findex_3);
              nextCur = (FIELD *)(long)iVar7;
              if (nextCur == (FIELD *)0x2) {
                lbl_1 = (cmCursesWidget *)0x0;
              }
              else if (nextCur == (FIELD *)(this->NumberOfVisibleEntries * 3 + -1)) {
                lbl_1 = (cmCursesWidget *)this->Fields[(long)((long)&nextCur[-1].usrptr + 3)];
              }
              else {
                lbl_1 = (cmCursesWidget *)this->Fields[(long)((long)&nextCur->status + 1)];
              }
              local_1e0 = (long *)field_userptr(this->Fields[(long)((long)&nextCur[-1].usrptr + 6)])
              ;
              if (local_1e0 != (long *)0x0) {
                pcVar13 = cmake::GetState(this->CMakeInstance);
                pcVar11 = (char *)(**(code **)(*local_1e0 + 0x28))();
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_200,pcVar11,
                           (allocator<char> *)(nextVal.field_2._M_local_buf + 0xf));
                cmState::RemoveCacheEntry(pcVar13,&local_200);
                std::__cxx11::string::~string((string *)&local_200);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(nextVal.field_2._M_local_buf + 0xf));
                std::__cxx11::string::string((string *)&nextEntryIt);
                if (lbl_1 != (cmCursesWidget *)0x0) {
                  plVar18 = (long *)field_userptr((FIELD *)lbl_1);
                  pcVar11 = (char *)(**(code **)(*plVar18 + 0x28))();
                  std::__cxx11::string::operator=((string *)&nextEntryIt,pcVar11);
                }
                if (_stdscr == (long *)0x0) {
                  local_35c = 0xffffffff;
                }
                else {
                  local_35c = (int)*(short *)((long)_stdscr + 4) + 1;
                }
                currentField._0_4_ = local_35c;
                pcVar11 = (char *)(**(code **)(*local_1e0 + 0x28))();
                RemoveEntry(this,pcVar11);
                RePost(this);
                (*(this->super_cmCursesForm)._vptr_cmCursesForm[3])();
                if (lbl_1 != (cmCursesWidget *)0x0) {
                  local_238._M_current =
                       (cmCursesCacheEntryComposite **)
                       std::
                       vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                       ::begin(this->Entries);
                  local_240 = (cmCursesCacheEntryComposite **)
                              std::
                              vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                              ::end(this->Entries);
                  local_248 = (string *)&nextEntryIt;
                  local_230 = std::
                              find_if<__gnu_cxx::__normal_iterator<cmCursesCacheEntryComposite**,std::vector<cmCursesCacheEntryComposite*,std::allocator<cmCursesCacheEntryComposite*>>>,cmCursesMainForm::HandleInput()::__0>
                                        (local_238,
                                         (__normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                                          )local_240,(anon_class_8_1_f1722e0e_for__M_pred)local_248)
                  ;
                  local_250._M_current =
                       (cmCursesCacheEntryComposite **)
                       std::
                       vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>
                       ::end(this->Entries);
                  bVar3 = __gnu_cxx::operator!=(&local_230,&local_250);
                  if (bVar3) {
                    form = (this->super_cmCursesForm).Form;
                    ppcVar19 = __gnu_cxx::
                               __normal_iterator<cmCursesCacheEntryComposite_**,_std::vector<cmCursesCacheEntryComposite_*,_std::allocator<cmCursesCacheEntryComposite_*>_>_>
                               ::operator*(&local_230);
                    set_current_field(form,(*ppcVar19)->Entry->Field);
                  }
                }
                std::__cxx11::string::~string((string *)&nextEntryIt);
              }
            }
            goto LAB_0014490c;
          }
        }
        form_driver((this->super_cmCursesForm).Form,0x200);
        goto LAB_0014490c;
      }
    }
    pFStack_f8 = current_field((this->super_cmCursesForm).Form);
    cur_2._4_4_ = field_index(pFStack_f8);
    if (cur_2._4_4_ != 2) {
      _Var2 = new_page(this->Fields[cur_2._4_4_ + -2]);
      if (_Var2) {
        form_driver((this->super_cmCursesForm).Form,0x201);
        set_current_field((this->super_cmCursesForm).Form,this->Fields[cur_2._4_4_ + -3]);
      }
      else {
        form_driver((this->super_cmCursesForm).Form,0x205);
      }
LAB_0014490c:
      if (_stdscr == (long *)0x0) {
        local_384 = -1;
      }
      else {
        local_384 = *(short *)((long)_stdscr + 4) + 1;
      }
      wtouchln(_stdscr,0,local_384,1);
      wrefresh(_stdscr);
    }
  } while( true );
}

Assistant:

void cmCursesMainForm::HandleInput()
{
  int x = 0, y = 0;

  if (!this->Form) {
    return;
  }

  FIELD* currentField;
  cmCursesWidget* currentWidget;

  char debugMessage[128];

  for (;;) {
    this->UpdateStatusBar();
    this->PrintKeys();
    if (this->SearchMode) {
      std::string searchstr = "Search: " + this->SearchString;
      this->UpdateStatusBar(searchstr.c_str());
      this->PrintKeys(1);
      curses_move(y - 5, static_cast<unsigned int>(searchstr.size()));
      // curses_move(1,1);
      touchwin(stdscr);
      refresh();
    }
    int key = getch();

    getmaxyx(stdscr, y, x);
    // If window too small, handle 'q' only
    if (x < cmCursesMainForm::MIN_WIDTH || y < cmCursesMainForm::MIN_HEIGHT) {
      // quit
      if (key == 'q') {
        break;
      }
      continue;
    }

    currentField = current_field(this->Form);
    currentWidget =
      reinterpret_cast<cmCursesWidget*>(field_userptr(currentField));

    bool widgetHandled = false;

    if (this->SearchMode) {
      if (key == 10 || key == KEY_ENTER) {
        this->SearchMode = false;
        if (!this->SearchString.empty()) {
          this->JumpToCacheEntry(this->SearchString.c_str());
          this->OldSearchString = this->SearchString;
        }
        this->SearchString = "";
      }
      /*
      else if ( key == KEY_ESCAPE )
        {
        this->SearchMode = false;
        }
      */
      else if ((key >= 'a' && key <= 'z') || (key >= 'A' && key <= 'Z') ||
               (key >= '0' && key <= '9') || (key == '_')) {
        if (this->SearchString.size() <
            static_cast<std::string::size_type>(x - 10)) {
          this->SearchString += static_cast<char>(key);
        }
      } else if (key == ctrl('h') || key == KEY_BACKSPACE || key == KEY_DC) {
        if (!this->SearchString.empty()) {
          this->SearchString.resize(this->SearchString.size() - 1);
        }
      }
    } else if (currentWidget && !this->SearchMode) {
      // Ask the current widget if it wants to handle input
      widgetHandled = currentWidget->HandleInput(key, this, stdscr);
      if (widgetHandled) {
        this->OkToGenerate = false;
        this->UpdateStatusBar();
        this->PrintKeys();
      }
    }
    if ((!currentWidget || !widgetHandled) && !this->SearchMode) {
      // If the current widget does not want to handle input,
      // we handle it.
      sprintf(debugMessage, "Main form handling input, key: %d", key);
      cmCursesForm::LogMessage(debugMessage);
      // quit
      if (key == 'q') {
        break;
      }
      // if not end of page, next field otherwise next page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow down, ctrl+n (emacs binding), or j (vim
      // binding)
      if (key == KEY_DOWN || key == ctrl('n') || key == 'j') {
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);
        if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          continue;
        }
        if (new_page(this->Fields[findex + 1])) {
          form_driver(this->Form, REQ_NEXT_PAGE);
        } else {
          form_driver(this->Form, REQ_NEXT_FIELD);
        }
      }
      // if not beginning of page, previous field, otherwise previous page
      // each entry consists of fields: label, isnew, value
      // therefore, the label field for the prev. entry is index-5
      // and the label field for the next entry is index+1
      // (index always corresponds to the value field)
      // scroll down with arrow up, ctrl+p (emacs binding), or k (vim binding)
      else if (key == KEY_UP || key == ctrl('p') || key == 'k') {
        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        if (findex == 2) {
          continue;
        }
        if (new_page(this->Fields[findex - 2])) {
          form_driver(this->Form, REQ_PREV_PAGE);
          set_current_field(this->Form, this->Fields[findex - 3]);
        } else {
          form_driver(this->Form, REQ_PREV_FIELD);
        }
      }
      // pg down
      else if (key == KEY_NPAGE || key == ctrl('d')) {
        form_driver(this->Form, REQ_NEXT_PAGE);
      }
      // pg up
      else if (key == KEY_PPAGE || key == ctrl('u')) {
        form_driver(this->Form, REQ_PREV_PAGE);
      }
      // configure
      else if (key == 'c') {
        this->Configure();
      }
      // display help
      else if (key == 'h') {
        getmaxyx(stdscr, y, x);

        FIELD* cur = current_field(this->Form);
        int findex = field_index(cur);
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        const char* curField = lbl->GetValue();
        const char* helpString = nullptr;

        const char* existingValue =
          this->CMakeInstance->GetState()->GetCacheEntryValue(curField);
        if (existingValue) {
          helpString = this->CMakeInstance->GetState()->GetCacheEntryProperty(
            curField, "HELPSTRING");
        }
        if (helpString) {
          char* message = new char
            [strlen(curField) + strlen(helpString) +
             strlen(
               "Current option is: \n Help string for this option is: \n") +
             10];
          sprintf(
            message,
            "Current option is: %s\nHelp string for this option is: %s\n",
            curField, helpString);
          this->HelpMessage[1] = message;
          delete[] message;
        } else {
          this->HelpMessage[1] = "";
        }

        cmCursesLongMessageForm* msgs =
          new cmCursesLongMessageForm(this->HelpMessage, "Help.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
        set_current_field(this->Form, cur);
      }
      // display last errors
      else if (key == 'l') {
        getmaxyx(stdscr, y, x);
        cmCursesLongMessageForm* msgs = new cmCursesLongMessageForm(
          this->Errors, "Errors occurred during the last pass.");
        CurrentForm = msgs;
        msgs->Render(1, 1, x, y);
        msgs->HandleInput();
        CurrentForm = this;
        this->Render(1, 1, x, y);
      } else if (key == '/') {
        this->SearchMode = true;
        this->UpdateStatusBar("Search");
        this->PrintKeys(1);
        touchwin(stdscr);
        refresh();
      } else if (key == 'n') {
        if (!this->OldSearchString.empty()) {
          this->JumpToCacheEntry(this->OldSearchString.c_str());
        }
      }
      // switch advanced on/off
      else if (key == 't') {
        if (this->AdvancedMode) {
          this->AdvancedMode = false;
        } else {
          this->AdvancedMode = true;
        }
        getmaxyx(stdscr, y, x);
        this->RePost();
        this->Render(1, 1, x, y);
      }
      // generate and exit
      else if (key == 'g') {
        if (this->OkToGenerate) {
          this->Generate();
          break;
        }
      }
      // delete cache entry
      else if (key == 'd' && this->NumberOfVisibleEntries) {
        this->OkToGenerate = false;
        FIELD* cur = current_field(this->Form);
        size_t findex = field_index(cur);

        // make the next or prev. current field after deletion
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the prev. entry is findex-5
        // and the label field for the next entry is findex+1
        // (findex always corresponds to the value field)
        FIELD* nextCur;
        if (findex == 2) {
          nextCur = nullptr;
        } else if (findex == 3 * this->NumberOfVisibleEntries - 1) {
          nextCur = this->Fields[findex - 5];
        } else {
          nextCur = this->Fields[findex + 1];
        }

        // Get the label widget
        // each entry consists of fields: label, isnew, value
        // therefore, the label field for the is findex-2
        // (findex always corresponds to the value field)
        cmCursesWidget* lbl = reinterpret_cast<cmCursesWidget*>(
          field_userptr(this->Fields[findex - 2]));
        if (lbl) {
          this->CMakeInstance->GetState()->RemoveCacheEntry(lbl->GetValue());

          std::string nextVal;
          if (nextCur) {
            nextVal =
              (reinterpret_cast<cmCursesWidget*>(field_userptr(nextCur))
                 ->GetValue());
          }

          getmaxyx(stdscr, y, x);
          this->RemoveEntry(lbl->GetValue());
          this->RePost();
          this->Render(1, 1, x, y);

          if (nextCur) {
            // make the next or prev. current field after deletion
            auto nextEntryIt =
              std::find_if(this->Entries->begin(), this->Entries->end(),
                           [&nextVal](cmCursesCacheEntryComposite* entry) {
                             return nextVal == entry->Key;
                           });

            if (nextEntryIt != this->Entries->end()) {
              set_current_field(this->Form, (*nextEntryIt)->Entry->Field);
            }
          }
        }
      }
    }

    touchwin(stdscr);
    wrefresh(stdscr);
  }
}